

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O1

void __thiscall cppnet::PoolAlloter::~PoolAlloter(PoolAlloter *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppMVar2;
  pointer ppcVar3;
  void *data;
  char *local_20;
  
  (this->super_Alloter)._vptr_Alloter = (_func_int **)&PTR__PoolAlloter_00124690;
  ppcVar3 = (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar3 !=
      (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (*ppcVar3 != (char *)0x0) {
        local_20 = *ppcVar3;
        peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar1->_vptr_Alloter[5])(peVar1,&local_20,0);
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 !=
             (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this_00 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ppcVar3 = (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3);
  }
  ppMVar2 = (this->_free_list).
            super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar2 != (pointer)0x0) {
    operator_delete(ppMVar2);
  }
  return;
}

Assistant:

PoolAlloter::~PoolAlloter() {
    for (auto iter = _malloc_vec.begin(); iter != _malloc_vec.end(); ++iter) {
        if (*iter) {
            void* data = (void*)*iter;
            _alloter->Free(data);
        }
    }
}